

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<int,(unsigned_char)4>>
          (Thread *this)

{
  u8 i;
  long lVar1;
  undefined2 uVar2;
  int iVar3;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  Simd<int,_(unsigned_char)__x04_> lhs;
  Simd<int,_(unsigned_char)__x04_> rhs;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_18.v128_.v = (v128)Pop(this);
  local_28.v128_.v = (v128)Pop(this);
  lVar1 = 0;
  do {
    iVar3 = *(int *)((long)&local_28 + lVar1 * 4);
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    uVar2 = (undefined2)iVar3;
    if (0xfffe < iVar3) {
      uVar2 = 0xffff;
    }
    *(undefined2 *)((long)&local_38 + lVar1 * 2) = uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    iVar3 = *(int *)((long)&local_18 + lVar1 * 4);
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    uVar2 = (undefined2)iVar3;
    if (0xfffe < iVar3) {
      uVar2 = 0xffff;
    }
    *(undefined2 *)((long)&local_38 + lVar1 * 2 + 8) = uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  Push(this,(Value)local_38.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result[i] = Saturate<SL, TL>(lhs[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result[T::lanes + i] = Saturate<SL, TL>(rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}